

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingBox.h
# Opt level: O2

bool __thiscall vera::BoundingBox::contains(BoundingBox *this,vec3 *_v)

{
  byte bVar1;
  
  bVar1 = 0;
  if (((this->min).field_0.x <= (_v->field_0).x) &&
     (bVar1 = 0, (_v->field_0).x <= (this->max).field_0.x)) {
    bVar1 = 0;
    if (((this->min).field_1.y <= (_v->field_1).y) && ((_v->field_1).y <= (this->max).field_1.y)) {
      bVar1 = -((_v->field_2).z <= (this->max).field_2.z) &
              -((this->min).field_2.z <= (_v->field_2).z);
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool        containsX(const float& _x) const { return _x >= min.x && _x <= max.x; }